

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

void xmlCleanupCharEncodingHandlers(void)

{
  xmlCharEncodingHandlerPtr pxVar1;
  int iVar2;
  ulong uVar3;
  xmlCharEncodingHandlerPtr *ppxVar4;
  
  xmlCleanupEncodingAliases();
  if (globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) {
    uVar3 = (ulong)(uint)nbCharEncodingHandler;
    ppxVar4 = globalHandlers;
    iVar2 = nbCharEncodingHandler;
    while (0 < iVar2) {
      nbCharEncodingHandler = (int)uVar3 - 1;
      uVar3 = (ulong)(uint)nbCharEncodingHandler;
      pxVar1 = ppxVar4[uVar3];
      if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
        if (pxVar1->name != (char *)0x0) {
          (*xmlFree)(pxVar1->name);
        }
        (*xmlFree)(pxVar1);
        uVar3 = (ulong)(uint)nbCharEncodingHandler;
        ppxVar4 = globalHandlers;
      }
      iVar2 = (int)uVar3;
    }
    (*xmlFree)(ppxVar4);
    globalHandlers = (xmlCharEncodingHandlerPtr *)0x0;
    nbCharEncodingHandler = 0;
  }
  return;
}

Assistant:

void
xmlCleanupCharEncodingHandlers(void) {
    xmlCleanupEncodingAliases();

    if (globalHandlers == NULL) return;

    for (;nbCharEncodingHandler > 0;) {
        xmlCharEncodingHandler *handler;

        nbCharEncodingHandler--;
        handler = globalHandlers[nbCharEncodingHandler];
	if (handler != NULL) {
	    if (handler->name != NULL)
		xmlFree(handler->name);
	    xmlFree(handler);
	}
    }
    xmlFree(globalHandlers);
    globalHandlers = NULL;
    nbCharEncodingHandler = 0;
}